

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O1

void UnitTest::_UnitTest_Compare::printFirst(void)

{
  char *__s;
  size_t sVar1;
  
  if (DAT_00106198 != '\0') {
    return;
  }
  __s = _unittest_fail();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070e0);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_3c50,4);
  return;
}

Assistant:

static void printFirst() {  // {{{2
    if (!global_unit_test_object_.vim_lines) {
      std::cout << _unittest_fail() << "┍ ";
    }
  }